

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O3

void blend_a64_vmask_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  long lVar1;
  undefined1 in_XMM0 [16];
  undefined1 auVar2 [16];
  short sVar3;
  short sVar5;
  undefined1 auVar4 [16];
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [16];
  
  lVar1 = 0;
  auVar2 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    auVar4 = pshuflw(ZEXT116(mask[lVar1]),ZEXT116(mask[lVar1]),0);
    sVar3 = auVar4._0_2_;
    sVar5 = auVar4._2_2_;
    auVar4 = pmovzxbw(ZEXT416(*(uint *)src0),ZEXT416(*(uint *)src0));
    auVar10 = pmovzxbw(ZEXT416(*(uint *)src1),ZEXT416(*(uint *)src1));
    sVar6 = pavgw((ushort)(auVar4._0_2_ * sVar3 + auVar10._0_2_ * (auVar2._0_2_ - sVar3)) >> 5,0);
    sVar7 = pavgw((ushort)(auVar4._2_2_ * sVar5 + auVar10._2_2_ * (auVar2._2_2_ - sVar5)) >> 5,0);
    sVar8 = pavgw((ushort)(auVar4._4_2_ * sVar3 + auVar10._4_2_ * (auVar2._4_2_ - sVar3)) >> 5,0);
    sVar9 = pavgw((ushort)(auVar4._6_2_ * sVar5 + auVar10._6_2_ * (auVar2._6_2_ - sVar5)) >> 5,0);
    pavgw((ushort)(auVar4._8_2_ * sVar3 + auVar10._8_2_ * (auVar2._8_2_ - sVar3)) >> 5,0);
    pavgw((ushort)(auVar4._10_2_ * sVar5 + auVar10._10_2_ * (auVar2._10_2_ - sVar5)) >> 5,0);
    pavgw((ushort)(auVar4._12_2_ * sVar3 + auVar10._12_2_ * (auVar2._12_2_ - sVar3)) >> 5,0);
    pavgw((ushort)(auVar4._14_2_ * sVar5 + auVar10._14_2_ * (auVar2._14_2_ - sVar5)) >> 5,0);
    *(uint *)dst = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9),
                            CONCAT12((0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8),
                                     CONCAT11((0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 -
                                              (0xff < sVar7),
                                              (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 -
                                              (0xff < sVar6))));
    dst = dst + dst_stride;
    src0 = (uint8_t *)((long)src0 + (ulong)src0_stride);
    src1 = (uint8_t *)((long)src1 + (ulong)src1_stride);
    lVar1 = lVar1 + 1;
  } while (h != (int)lVar1);
  return;
}

Assistant:

static void blend_a64_vmask_w4_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                      const uint8_t *src0, uint32_t src0_stride,
                                      const uint8_t *src1, uint32_t src1_stride,
                                      const uint8_t *mask, int w, int h) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  (void)w;

  do {
    const __m128i v_m0_w = _mm_set1_epi16(*mask);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

    const __m128i v_res_w = blend_4(src0, src1, &v_m0_w, &v_m1_w);

    const __m128i v_res_b = _mm_packus_epi16(v_res_w, v_res_w);

    xx_storel_32(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 1;
  } while (--h);
}